

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>::
operator()(CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>
           *this,_func_void_String_ptr_size_t *deleter,String *data,size_t size)

{
  String *this_00;
  size_t size_local;
  String *data_local;
  _func_void_String_ptr_size_t *deleter_local;
  CallDeleter<Corrade::Containers::String,_void_(*)(Corrade::Containers::String_*,_unsigned_long)>
  *this_local;
  
  if (deleter == (_func_void_String_ptr_size_t *)0x0) {
    if (data != (String *)0x0) {
      this_00 = data + data[-1].field_0._large.size;
      while (data != this_00) {
        this_00 = this_00 + -1;
        Containers::String::~String(this_00);
      }
      operator_delete__((void *)((long)&data[-1].field_0 + 0x10));
    }
  }
  else {
    (*deleter)(data,size);
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }